

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O3

ON_Curve * __thiscall ON_PlaneSurface::IsoCurve(ON_PlaneSurface *this,int dir,double c)

{
  int iVar1;
  double *pdVar2;
  ON_LineCurve *this_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_Interval domain;
  ON_Line line;
  ON_3dPoint local_70;
  ON_Interval local_58;
  ON_Line local_48;
  
  if ((uint)dir < 2) {
    this_00 = (ON_LineCurve *)0x0;
    iVar1 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0)
    ;
    if ((char)iVar1 != '\0') {
      ON_Line::ON_Line(&local_48);
      (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
      local_58.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      local_58.m_t[1] = in_XMM1_Qa;
      if (dir == 1) {
        pdVar2 = ON_Interval::operator[](&local_58,0);
        ON_Surface::PointAt(&local_70,&this->super_ON_Surface,c,*pdVar2);
        local_48.from.z = local_70.z;
        local_48.from.x = local_70.x;
        local_48.from.y = local_70.y;
        pdVar2 = ON_Interval::operator[](&local_58,1);
        ON_Surface::PointAt(&local_70,&this->super_ON_Surface,c,*pdVar2);
      }
      else {
        pdVar2 = ON_Interval::operator[](&local_58,0);
        ON_Surface::PointAt(&local_70,&this->super_ON_Surface,*pdVar2,c);
        local_48.from.z = local_70.z;
        local_48.from.x = local_70.x;
        local_48.from.y = local_70.y;
        pdVar2 = ON_Interval::operator[](&local_58,1);
        ON_Surface::PointAt(&local_70,&this->super_ON_Surface,*pdVar2,c);
      }
      local_48.to.z = local_70.z;
      local_48.to.x = local_70.x;
      local_48.to.y = local_70.y;
      this_00 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve(this_00,&local_48);
      this_00->m_dim = 3;
      (this_00->m_t).m_t[0] = local_58.m_t[0];
      (this_00->m_t).m_t[1] = local_58.m_t[1];
      ON_Line::~ON_Line(&local_48);
    }
  }
  else {
    this_00 = (ON_LineCurve *)0x0;
  }
  return &this_00->super_ON_Curve;
}

Assistant:

ON_Curve* ON_PlaneSurface::IsoCurve( int dir, double c ) const
{
  ON_LineCurve* line_curve = 0;
  if ( (dir == 0 || dir == 1) && IsValid() ) 
  {
    ON_Line line;
    ON_Interval domain = Domain(dir);
    if ( dir == 1 )
    {
      line.from = PointAt( c, domain[0] );
      line.to = PointAt( c, domain[1] );
    }
    else
    {
      line.from = PointAt( domain[0], c );
      line.to = PointAt( domain[1], c );
    }
    line_curve = new ON_LineCurve(line);
    line_curve->m_dim = 3;
    line_curve->m_t = domain;
  }
  return line_curve;
}